

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestFactory<RenderTest_RadianceMatches_Test>::
~ParameterizedTestFactory(ParameterizedTestFactory<RenderTest_RadianceMatches_Test> *this)

{
  ~ParameterizedTestFactory(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter) :
      parameter_(parameter) {}